

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O1

bool __thiscall
Js::WebAssemblySharedArrayBuffer::GrowMemory
          (WebAssemblySharedArrayBuffer *this,uint32 newBufferLength)

{
  uint uVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  char cVar5;
  undefined4 *puVar6;
  Recycler *pRVar7;
  LPVOID pvVar8;
  ulong size;
  AutoExternalAllocation local_50;
  BYTE *local_38;
  
  pSVar2 = (this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents;
  uVar1 = pSVar2->bufferLength;
  if ((newBufferLength < uVar1) || (pSVar2->maxBufferLength < newBufferLength)) {
    if (pSVar2->maxBufferLength < newBufferLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                  ,0x23a,"(newBufferLength <= sharedContents->maxBufferLength)",
                                  "This shouldn\'t happen");
      if (!bVar4) goto LAB_00d5c5f9;
      *puVar6 = 0;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x23b,"((0))","UNREACHED");
    if (bVar4) {
      *puVar6 = 0;
      JavascriptError::ThrowTypeError
                ((((((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.
                     super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.type.ptr)->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                 -0x7ff5e492,(PCWSTR)0x0);
    }
LAB_00d5c5f9:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if (newBufferLength == uVar1) {
    return true;
  }
  local_38 = pSVar2->buffer;
  if (local_38 == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x247,"(buffer)","buffer");
    if (!bVar4) goto LAB_00d5c5f9;
    *puVar6 = 0;
  }
  cVar5 = (**(code **)((long)(this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.
                             super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x398))(this);
  size = (ulong)(newBufferLength - uVar1);
  if (cVar5 == '\0') {
LAB_00d5c503:
    memset(local_38 + uVar1,0,size);
    ((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents)->bufferLength
         = newBufferLength;
    bVar4 = true;
  }
  else {
    pRVar7 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    bVar4 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar7,size);
    if (bVar4) {
LAB_00d5c4b9:
      local_50.allocationSucceeded = false;
      local_50.recycler = pRVar7;
      local_50.size = size;
      pvVar8 = VirtualAlloc(local_38 + uVar1,size,0x1000,4);
      if (pvVar8 != (LPVOID)0x0) {
        local_50.allocationSucceeded = true;
        anon_func::AutoExternalAllocation::~AutoExternalAllocation(&local_50);
        pRVar7 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        Memory::Recycler::AddExternalMemoryUsage(pRVar7,size);
        goto LAB_00d5c503;
      }
      anon_func::AutoExternalAllocation::~AutoExternalAllocation(&local_50);
    }
    else {
      Memory::Recycler::CollectNow<(Memory::CollectionFlags)404852739>(pRVar7);
      bVar4 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar7,size);
      if (bVar4) goto LAB_00d5c4b9;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

_Must_inspect_result_ bool WebAssemblySharedArrayBuffer::GrowMemory(uint32 newBufferLength)
    {
        uint32 bufferLength = sharedContents->bufferLength;
        BYTE* buffer = sharedContents->buffer;
        if (newBufferLength < bufferLength || newBufferLength > sharedContents->maxBufferLength)
        {
            AssertMsg(newBufferLength <= sharedContents->maxBufferLength, "This shouldn't happen");
            Assert(UNREACHED);
            JavascriptError::ThrowTypeError(GetScriptContext(), WASMERR_BufferGrowOnly);
        }

        uint32 growSize = newBufferLength - bufferLength;

        // We're not growing the buffer, do nothing
        if (growSize == 0)
        {
            return true;
        }

        AssertOrFailFast(buffer);
        if (IsValidVirtualBufferLength(newBufferLength))
        {
            auto virtualAllocFunc = [=]
            {
                return !!VirtualAlloc(buffer + bufferLength, growSize, MEM_COMMIT, PAGE_READWRITE);
            };
            if (!this->GetRecycler()->DoExternalAllocation(growSize, virtualAllocFunc))
            {
                return false;
            }

            this->GetRecycler()->AddExternalMemoryUsage(growSize);
        }
        else
        {
            // We have already allocated maxLength in the heap if we're not using virtual alloc
        }
        ZeroMemory(buffer + bufferLength, growSize);
        sharedContents->bufferLength = newBufferLength;
        ValidateBuffer();
        return true;
    }